

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

CoatedConductorMaterial *
pbrt::CoatedConductorMaterial::Create
          (TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  Allocator alloc_00;
  Allocator alloc_01;
  bool bVar1;
  byte bVar2;
  int iVar3;
  CoatedConductorMaterial *pCVar4;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool remapRoughness;
  FloatTextureHandle displacement;
  SpectrumTextureHandle albedo;
  FloatTextureHandle g;
  LayeredBxDFConfig config;
  SpectrumTextureHandle k;
  SpectrumTextureHandle conductorEta;
  FloatTextureHandle conductorVRoughness;
  FloatTextureHandle conductorURoughness;
  FloatTextureHandle interfaceEta;
  FloatTextureHandle thickness;
  FloatTextureHandle interfaceVRoughness;
  FloatTextureHandle interfaceURoughness;
  string *in_stack_fffffffffffff9d8;
  TextureParameterDictionary *in_stack_fffffffffffff9e0;
  ConstantSpectrum **in_stack_fffffffffffff9e8;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffff9f0;
  string *in_stack_fffffffffffff9f8;
  SpectrumType spectrumType;
  TextureParameterDictionary *in_stack_fffffffffffffa00;
  Allocator in_stack_fffffffffffffa08;
  TextureParameterDictionary *in_stack_fffffffffffffa10;
  undefined7 in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa20;
  FloatTextureHandle *args_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  string *in_stack_fffffffffffffa38;
  string *name;
  TextureParameterDictionary *in_stack_fffffffffffffa40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Allocator in_stack_fffffffffffffa48;
  Allocator AVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  SpectrumTextureHandle *args_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6;
  FloatTextureHandle *args_7;
  SpectrumTextureHandle *args_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_9;
  FloatTextureHandle *args_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac0;
  LayeredBxDFConfig *in_stack_fffffffffffffac8;
  undefined8 local_499;
  byte local_471;
  undefined8 local_470;
  undefined1 local_461 [45];
  undefined4 local_434;
  ConstantSpectrum *local_430;
  undefined8 local_420;
  undefined8 local_409;
  TaggedPointer local_3e8 [8];
  undefined8 local_3e0;
  allocator<char> local_3d1;
  string local_3d0 [47];
  allocator<char> local_3a1;
  string local_3a0 [39];
  allocator<char> local_379;
  string local_378 [37];
  LayeredBxDFConfig local_353;
  undefined8 local_350;
  undefined8 local_341;
  undefined8 local_311;
  undefined8 local_2e8;
  undefined8 local_2d9;
  undefined8 local_2a9;
  undefined8 local_280;
  LayeredBxDFConfig local_271 [13];
  undefined8 local_248;
  allocator<char> local_239;
  string local_238 [40];
  undefined8 local_210;
  allocator<char> local_201;
  string local_200 [32];
  TaggedPointer local_1e0 [8];
  undefined8 local_1d8;
  allocator<char> local_1c9;
  string local_1c8 [32];
  TaggedPointer local_1a8 [8];
  undefined8 local_1a0;
  allocator<char> local_191;
  string local_190 [40];
  undefined8 local_168;
  allocator<char> local_159;
  string local_158 [40];
  undefined8 local_130;
  allocator<char> local_121;
  string local_120 [40];
  undefined8 local_f8;
  allocator<char> local_e9;
  string local_e8 [40];
  undefined8 local_c0;
  allocator<char> local_b1;
  string local_b0 [32];
  TaggedPointer local_90 [8];
  undefined8 local_88;
  allocator<char> local_69;
  string local_68 [32];
  TaggedPointer local_48 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  undefined8 local_30;
  
  local_38 = in_RDI;
  local_30 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (allocator<char> *)in_stack_fffffffffffffa10);
  local_88 = local_30;
  TextureParameterDictionary::GetFloatTextureOrNull
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (allocator<char> *)in_stack_fffffffffffffa10);
  local_c0 = local_30;
  TextureParameterDictionary::GetFloatTextureOrNull
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa48);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_48);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa20,
               (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
               (allocator<char> *)in_stack_fffffffffffffa10);
    local_f8 = local_30;
    TextureParameterDictionary::GetFloatTexture
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
               (Float)((ulong)in_stack_fffffffffffff9f0 >> 0x20),in_stack_fffffffffffffa08);
    FloatTextureHandle::operator=
              ((FloatTextureHandle *)in_stack_fffffffffffff9e0,
               (FloatTextureHandle *)in_stack_fffffffffffff9d8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_90);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa20,
               (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
               (allocator<char> *)in_stack_fffffffffffffa10);
    local_130 = local_30;
    TextureParameterDictionary::GetFloatTexture
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
               (Float)((ulong)in_stack_fffffffffffff9f0 >> 0x20),in_stack_fffffffffffffa08);
    FloatTextureHandle::operator=
              ((FloatTextureHandle *)in_stack_fffffffffffff9e0,
               (FloatTextureHandle *)in_stack_fffffffffffff9d8);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator(&local_121);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (allocator<char> *)in_stack_fffffffffffffa10);
  local_168 = local_30;
  TextureParameterDictionary::GetFloatTexture
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (Float)((ulong)in_stack_fffffffffffff9f0 >> 0x20),in_stack_fffffffffffffa08);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (allocator<char> *)in_stack_fffffffffffffa10);
  local_1a0 = local_30;
  TextureParameterDictionary::GetFloatTexture
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (Float)((ulong)in_stack_fffffffffffff9f0 >> 0x20),in_stack_fffffffffffffa08);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (allocator<char> *)in_stack_fffffffffffffa10);
  local_1d8 = local_30;
  TextureParameterDictionary::GetFloatTextureOrNull
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa48);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (allocator<char> *)in_stack_fffffffffffffa10);
  local_210 = local_30;
  TextureParameterDictionary::GetFloatTextureOrNull
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,in_stack_fffffffffffffa48);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_1a8);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa20,
               (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
               (allocator<char> *)in_stack_fffffffffffffa10);
    local_248 = local_30;
    TextureParameterDictionary::GetFloatTexture
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
               (Float)((ulong)in_stack_fffffffffffff9f0 >> 0x20),in_stack_fffffffffffffa08);
    FloatTextureHandle::operator=
              ((FloatTextureHandle *)in_stack_fffffffffffff9e0,
               (FloatTextureHandle *)in_stack_fffffffffffff9d8);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator(&local_239);
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_1e0);
  if (!bVar1) {
    in_stack_fffffffffffffac8 = local_271;
    in_stack_fffffffffffffac0 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa20,
               (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
               (allocator<char> *)in_stack_fffffffffffffa10);
    local_280 = local_30;
    TextureParameterDictionary::GetFloatTexture
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
               (Float)((ulong)in_stack_fffffffffffff9f0 >> 0x20),in_stack_fffffffffffffa08);
    FloatTextureHandle::operator=
              ((FloatTextureHandle *)in_stack_fffffffffffff9e0,
               (FloatTextureHandle *)in_stack_fffffffffffff9d8);
    std::__cxx11::string::~string((string *)&local_271[0].nSamples);
    std::allocator<char>::~allocator((allocator<char> *)local_271);
  }
  args_10 = (FloatTextureHandle *)&local_2a9;
  args_9 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (allocator<char> *)in_stack_fffffffffffffa10);
  args_8 = (SpectrumTextureHandle *)&local_2d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (allocator<char> *)in_stack_fffffffffffffa10);
  GetNamedSpectrum(in_stack_fffffffffffff9f8);
  local_2e8 = local_30;
  AVar5.memoryResource._7_1_ = in_stack_fffffffffffffa1f;
  AVar5.memoryResource._0_7_ = in_stack_fffffffffffffa18;
  TextureParameterDictionary::GetSpectrumTexture
            (in_stack_fffffffffffffa10,(string *)in_stack_fffffffffffffa08.memoryResource,
             (SpectrumHandle *)in_stack_fffffffffffffa00,
             (SpectrumType)((ulong)in_stack_fffffffffffff9f8 >> 0x20),AVar5);
  std::__cxx11::string::~string((string *)((long)&local_2d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::~string((string *)((long)&local_2a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  args_7 = (FloatTextureHandle *)&local_311;
  args_6 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (allocator<char> *)in_stack_fffffffffffffa10);
  args_5 = (SpectrumTextureHandle *)&local_341;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (allocator<char> *)in_stack_fffffffffffffa10);
  GetNamedSpectrum(in_stack_fffffffffffff9f8);
  local_350 = local_30;
  alloc_00.memoryResource._7_1_ = in_stack_fffffffffffffa1f;
  alloc_00.memoryResource._0_7_ = in_stack_fffffffffffffa18;
  TextureParameterDictionary::GetSpectrumTexture
            (in_stack_fffffffffffffa10,(string *)in_stack_fffffffffffffa08.memoryResource,
             (SpectrumHandle *)in_stack_fffffffffffffa00,
             (SpectrumType)((ulong)in_stack_fffffffffffff9f8 >> 0x20),alloc_00);
  std::__cxx11::string::~string((string *)((long)&local_341 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string((string *)((long)&local_311 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  LayeredBxDFConfig::LayeredBxDFConfig(&local_353);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (allocator<char> *)in_stack_fffffffffffffa10);
  iVar3 = TextureParameterDictionary::GetOneInt
                    (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,0);
  local_353.maxDepth = (uint8_t)iVar3;
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (allocator<char> *)in_stack_fffffffffffffa10);
  iVar3 = TextureParameterDictionary::GetOneInt
                    (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,0);
  local_353.nSamples = (uint8_t)iVar3;
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  this_00 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (allocator<char> *)in_stack_fffffffffffffa10);
  local_3e0 = local_30;
  TextureParameterDictionary::GetFloatTexture
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
             (Float)((ulong)in_stack_fffffffffffff9f0 >> 0x20),in_stack_fffffffffffffa08);
  spectrumType = (SpectrumType)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  AVar5.memoryResource = (memory_resource *)&local_409;
  this = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (allocator<char> *)in_stack_fffffffffffffa10);
  SpectrumHandle::TaggedPointer
            ((SpectrumHandle *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
  local_420 = local_30;
  alloc_01.memoryResource._7_1_ = in_stack_fffffffffffffa1f;
  alloc_01.memoryResource._0_7_ = in_stack_fffffffffffffa18;
  TextureParameterDictionary::GetSpectrumTexture
            (in_stack_fffffffffffffa10,(string *)in_stack_fffffffffffffa08.memoryResource,
             (SpectrumHandle *)in_stack_fffffffffffffa00,spectrumType,alloc_01);
  std::__cxx11::string::~string((string *)((long)&local_409 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_3e8);
  if (!bVar1) {
    local_434 = 0;
    local_430 = pstd::pmr::polymorphic_allocator<std::byte>::
                new_object<pbrt::ConstantSpectrum,float>
                          (in_stack_fffffffffffff9f0,(float *)in_stack_fffffffffffff9e8);
    pstd::pmr::polymorphic_allocator<std::byte>::
    new_object<pbrt::SpectrumConstantTexture,pbrt::ConstantSpectrum*>
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    SpectrumTextureHandle::TaggedPointer<pbrt::SpectrumConstantTexture>
              ((SpectrumTextureHandle *)in_stack_fffffffffffff9e0,
               (SpectrumConstantTexture *)in_stack_fffffffffffff9d8);
    SpectrumTextureHandle::operator=
              ((SpectrumTextureHandle *)in_stack_fffffffffffff9e0,
               (SpectrumTextureHandle *)in_stack_fffffffffffff9d8);
  }
  name = (string *)local_461;
  args_3 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (allocator<char> *)in_stack_fffffffffffffa10);
  local_470 = local_30;
  TextureParameterDictionary::GetFloatTextureOrNull((TextureParameterDictionary *)this,name,AVar5);
  std::__cxx11::string::~string((string *)(local_461 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_461);
  args_4 = (FloatTextureHandle *)&local_499;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,(char *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (allocator<char> *)in_stack_fffffffffffffa10);
  bVar2 = TextureParameterDictionary::GetOneBool
                    (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,false);
  std::__cxx11::string::~string((string *)((long)&local_499 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  local_471 = bVar2 & 1;
  pCVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::CoatedConductorMaterial,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,bool&,pbrt::LayeredBxDFConfig&>
                     ((polymorphic_allocator<std::byte> *)this_00,
                      (FloatTextureHandle *)AVar5.memoryResource,(FloatTextureHandle *)this,
                      (FloatTextureHandle *)name,(FloatTextureHandle *)args_3,args_4,args_5,
                      (FloatTextureHandle *)args_6,args_7,args_8,(SpectrumTextureHandle *)args_9,
                      args_10,(bool *)in_stack_fffffffffffffac0,in_stack_fffffffffffffac8);
  return pCVar4;
}

Assistant:

CoatedConductorMaterial *CoatedConductorMaterial::Create(
    const TextureParameterDictionary &parameters, const FileLoc *loc, Allocator alloc) {
    // interface
    FloatTextureHandle interfaceURoughness =
        parameters.GetFloatTextureOrNull("interface.uroughness", alloc);
    FloatTextureHandle interfaceVRoughness =
        parameters.GetFloatTextureOrNull("interface.vroughness", alloc);
    if (!interfaceURoughness)
        interfaceURoughness =
            parameters.GetFloatTexture("interface.roughness", 0.f, alloc);
    if (!interfaceVRoughness)
        interfaceVRoughness =
            parameters.GetFloatTexture("interface.roughness", 0.f, alloc);

    FloatTextureHandle thickness = parameters.GetFloatTexture("thickness", .01, alloc);
    FloatTextureHandle interfaceEta =
        parameters.GetFloatTexture("interface.eta", 1.5, alloc);

    // conductor
    FloatTextureHandle conductorURoughness =
        parameters.GetFloatTextureOrNull("conductor.uroughness", alloc);
    FloatTextureHandle conductorVRoughness =
        parameters.GetFloatTextureOrNull("conductor.vroughness", alloc);
    if (!conductorURoughness)
        conductorURoughness =
            parameters.GetFloatTexture("conductor.roughness", 0.f, alloc);
    if (!conductorVRoughness)
        conductorVRoughness =
            parameters.GetFloatTexture("conductor.roughness", 0.f, alloc);
    SpectrumTextureHandle conductorEta = parameters.GetSpectrumTexture(
        "conductor.eta", GetNamedSpectrum("metal-Cu-eta"), SpectrumType::General, alloc);
    SpectrumTextureHandle k = parameters.GetSpectrumTexture(
        "conductor.k", GetNamedSpectrum("metal-Cu-k"), SpectrumType::General, alloc);

    LayeredBxDFConfig config;
    config.maxDepth = parameters.GetOneInt("maxdepth", config.maxDepth);
    config.nSamples = parameters.GetOneInt("nsamples", config.nSamples);

    FloatTextureHandle g = parameters.GetFloatTexture("g", 0.f, alloc);
    SpectrumTextureHandle albedo = parameters.GetSpectrumTexture(
        "albedo", nullptr, SpectrumType::Reflectance, alloc);
    if (!albedo)
        albedo = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.f));

    FloatTextureHandle displacement =
        parameters.GetFloatTextureOrNull("displacement", alloc);
    bool remapRoughness = parameters.GetOneBool("remaproughness", true);

    return alloc.new_object<CoatedConductorMaterial>(
        interfaceURoughness, interfaceVRoughness, thickness, interfaceEta, g, albedo,
        conductorURoughness, conductorVRoughness, conductorEta, k, displacement,
        remapRoughness, config);
}